

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

void __thiscall
rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
GenericValue<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
          (GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          *rhs,CrtAllocator *allocator,bool copyConstStrings)

{
  ushort uVar1;
  uint uVar2;
  Ch *pCVar3;
  ushort uVar4;
  ulong uVar5;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *rhs_00;
  GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this_00;
  GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *local_50;
  StringRefType local_40;
  
  uVar1 = (rhs->data_).f.flags;
  uVar4 = uVar1 & 7;
  if (uVar4 == 5) {
    if (uVar1 != 0x405 || copyConstStrings) {
      pCVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(rhs);
      local_40.length =
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetStringLength(rhs);
      local_40.s = "";
      if (pCVar3 != (Ch *)0x0) {
        local_40.s = pCVar3;
      }
      if (local_40.length == 0 || pCVar3 != (Ch *)0x0) {
        GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::SetStringRaw
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,&local_40,
                   allocator);
        return;
      }
      __assert_fail("str != 0 || len == 0u",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                    ,0x19c,
                    "rapidjson::GenericStringRef<char>::GenericStringRef(const CharType *, SizeType) [CharType = char]"
                   );
    }
  }
  else {
    if (uVar4 == 4) {
      uVar2 = (rhs->data_).s.length;
      uVar5 = (ulong)uVar2;
      if (uVar5 == 0) {
        local_50 = (GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)0x0;
      }
      else {
        local_50 = (GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)malloc(uVar5 << 4)
        ;
      }
      if (uVar2 != 0) {
        rhs_00 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)((ulong)(rhs->data_).s.str & 0xffffffffffff);
        this_00 = local_50;
        do {
          GenericValue<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    (this_00,rhs_00,allocator,copyConstStrings);
          this_00 = this_00 + 0x10;
          rhs_00 = rhs_00 + 1;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      *(uint *)(this + 4) = uVar2;
      *(uint *)this = uVar2;
      *(ulong *)(this + 8) = (ulong)local_50 | 0x4000000000000;
      return;
    }
    if (uVar4 == 3) {
      DoCopyMembers<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                (this,rhs,allocator,copyConstStrings);
      return;
    }
  }
  *(ushort *)(this + 0xe) = uVar1;
  pCVar3 = (rhs->data_).s.str;
  *(Number *)this = (rhs->data_).n;
  *(Ch **)(this + 8) = pCVar3;
  return;
}

Assistant:

GenericValue(const GenericValue<Encoding,SourceAllocator>& rhs, Allocator& allocator, bool copyConstStrings = false) {
        switch (rhs.GetType()) {
        case kObjectType:
            DoCopyMembers(rhs, allocator, copyConstStrings);
            break;
        case kArrayType: {
                SizeType count = rhs.data_.a.size;
                GenericValue* le = reinterpret_cast<GenericValue*>(allocator.Malloc(count * sizeof(GenericValue)));
                const GenericValue<Encoding,SourceAllocator>* re = rhs.GetElementsPointer();
                for (SizeType i = 0; i < count; i++)
                    new (&le[i]) GenericValue(re[i], allocator, copyConstStrings);
                data_.f.flags = kArrayFlag;
                data_.a.size = data_.a.capacity = count;
                SetElementsPointer(le);
            }
            break;
        case kStringType:
            if (rhs.data_.f.flags == kConstStringFlag && !copyConstStrings) {
                data_.f.flags = rhs.data_.f.flags;
                data_  = *reinterpret_cast<const Data*>(&rhs.data_);
            }
            else
                SetStringRaw(StringRef(rhs.GetString(), rhs.GetStringLength()), allocator);
            break;
        default:
            data_.f.flags = rhs.data_.f.flags;
            data_  = *reinterpret_cast<const Data*>(&rhs.data_);
            break;
        }
    }